

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimClassRefineOne(Cec_ManSim_t *p,int i)

{
  int iVar1;
  Vec_Int_t *p_00;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_01;
  long lVar8;
  
  iVar7 = 0;
  while( true ) {
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_IntPush(p_00,i);
    puVar2 = p->pMems;
    p_01 = p->pAig;
    lVar8 = (long)i;
    iVar6 = p->pSimInfo[lVar8];
    iVar4 = Gia_ObjIsHead(p_01,i);
    if (iVar4 == 0) {
      __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x114,"int Cec_ManSimClassRefineOne(Cec_ManSim_t *, int)");
    }
    while( true ) {
      iVar4 = p_01->pNexts[lVar8];
      lVar8 = (long)iVar4;
      if (lVar8 == 0) break;
      puVar3 = p->pMems;
      iVar1 = p->pSimInfo[lVar8];
      iVar5 = Cec_ManSimCompareEqual(puVar2 + (long)iVar6 + 1,puVar3 + (long)iVar1 + 1,p->nWords);
      if (iVar5 == 0) {
        Vec_IntPush(p->vClassNew,iVar4);
        if (p->pBestState != (Abc_Cex_t *)0x0) {
          Cec_ManSimCompareEqualScore
                    (puVar2 + (long)iVar6 + 1,puVar3 + (long)iVar1 + 1,p->nWords,p->pScores);
        }
      }
      else {
        Vec_IntPush(p->vClassOld,iVar4);
      }
      p_01 = p->pAig;
    }
    if (p->vClassNew->nSize == 0) break;
    Cec_ManSimClassCreate(p_01,p->vClassOld);
    Cec_ManSimClassCreate(p->pAig,p->vClassNew);
    if (p->vClassNew->nSize < 2) {
      iVar6 = 1;
      goto LAB_004d0040;
    }
    i = Vec_IntEntry(p->vClassNew,0);
    iVar7 = iVar7 + 1;
  }
  iVar6 = 0;
LAB_004d0040:
  return iVar6 + iVar7;
}

Assistant:

int Cec_ManSimClassRefineOne( Cec_ManSim_t * p, int i )
{
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pSim0 = Cec_ObjSim(p, i);
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pSim1 = Cec_ObjSim(p, Ent);
        if ( Cec_ManSimCompareEqual( pSim0, pSim1, p->nWords ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
        {
            Vec_IntPush( p->vClassNew, Ent );
            if ( p->pBestState )
                Cec_ManSimCompareEqualScore( pSim0, pSim1, p->nWords, p->pScores );
        }
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Cec_ManSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}